

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O2

mz_bool mz_zip_reader_extract_to_mem_no_alloc
                  (mz_zip_archive *pZip,mz_uint file_index,void *pBuf,size_t buf_size,mz_uint flags,
                  void *pUser_read_buf,size_t user_read_buf_size)

{
  mz_bool mVar1;
  tinfl_status tVar2;
  size_t sVar3;
  size_t sVar4;
  mz_ulong mVar5;
  mz_uint64 mVar6;
  long lVar7;
  ulong uVar8;
  ulong local_2fd8;
  void *local_2fd0;
  mz_uint64 local_2fc8;
  ulong local_2fc0;
  size_t out_buf_size;
  size_t in_buf_size;
  mz_uint32 local_header_u32 [8];
  mz_zip_archive_file_stat file_stat;
  tinfl_decompressor inflator;
  
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  if ((((pZip->m_pState == (mz_zip_internal_state *)0x0) || (pBuf == (void *)0x0 && buf_size != 0))
      || (pUser_read_buf == (void *)0x0 && user_read_buf_size != 0)) ||
     (pZip->m_pRead == (mz_file_read_func)0x0)) {
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  mVar1 = mz_zip_reader_file_stat(pZip,file_index,&file_stat);
  if (mVar1 == 0) {
    return 0;
  }
  if (file_stat.m_comp_size == 0 || file_stat.m_is_directory != 0) {
    return 1;
  }
  if (((byte)file_stat.m_bit_flag & 0x61) != 0) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
    return 0;
  }
  if (((flags >> 10 & 1) == 0) && ((file_stat.m_method & 0xfff7) != 0)) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_METHOD;
    return 0;
  }
  mVar6 = file_stat.m_comp_size;
  if ((flags >> 10 & 1) == 0) {
    mVar6 = file_stat.m_uncomp_size;
  }
  if (buf_size < mVar6) {
    pZip->m_last_error = MZ_ZIP_BUF_TOO_SMALL;
    return 0;
  }
  sVar3 = (*pZip->m_pRead)(pZip->m_pIO_opaque,file_stat.m_local_header_ofs,local_header_u32,0x1e);
  if (sVar3 != 0x1e) {
LAB_00149ab2:
    pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
    return 0;
  }
  if (local_header_u32[0] != 0x4034b50) {
LAB_001498d5:
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    return 0;
  }
  local_2fd8 = file_stat.m_comp_size;
  if (pZip->m_archive_size <
      (ulong)(ushort)local_header_u32[7] + file_stat.m_local_header_ofs + local_header_u32[6]._2_2_
      + file_stat.m_comp_size + 0x1e) goto LAB_001498d5;
  local_2fc8 = (ulong)(ushort)local_header_u32[7] +
               file_stat.m_local_header_ofs + local_header_u32[6]._2_2_ + 0x1e;
  if (((flags >> 10 & 1) != 0) || (file_stat.m_method == 0)) {
    sVar3 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_2fc8,pBuf,mVar6);
    if (sVar3 == mVar6) {
      if ((flags >> 10 & 1) != 0) {
        return 1;
      }
      mVar5 = mz_crc32(0,(mz_uint8 *)pBuf,file_stat.m_uncomp_size);
      if (mVar5 != file_stat.m_crc32) {
        pZip->m_last_error = MZ_ZIP_CRC_CHECK_FAILED;
        return 0;
      }
      return 1;
    }
    goto LAB_00149ab2;
  }
  inflator.m_state = 0;
  local_2fd0 = pZip->m_pState->m_pMem;
  if (local_2fd0 == (void *)0x0) {
    if (pUser_read_buf == (void *)0x0) {
      local_2fc0 = file_stat.m_comp_size;
      if (0xffff < file_stat.m_comp_size) {
        local_2fc0 = 0x10000;
      }
      local_2fd0 = (*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,local_2fc0);
      if (local_2fd0 == (void *)0x0) {
        pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
        return 0;
      }
      local_2fd8 = file_stat.m_comp_size;
      file_stat.m_comp_size = 0;
    }
    else {
      file_stat.m_comp_size = 0;
      if (user_read_buf_size == 0) {
        return 0;
      }
      local_2fc0 = user_read_buf_size;
      local_2fd0 = pUser_read_buf;
    }
  }
  else {
    local_2fd0 = (void *)((long)local_2fd0 + local_2fc8);
    local_2fd8 = 0;
    local_2fc0 = file_stat.m_comp_size;
  }
  sVar3 = 0;
  lVar7 = 0;
  uVar8 = file_stat.m_comp_size;
  do {
    out_buf_size = file_stat.m_uncomp_size - sVar3;
    if (uVar8 == 0) {
      if (pZip->m_pState->m_pMem == (void *)0x0) {
        uVar8 = local_2fd8;
        if (local_2fc0 < local_2fd8) {
          uVar8 = local_2fc0;
        }
        sVar4 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_2fc8,local_2fd0,uVar8);
        if (sVar4 != uVar8) {
          pZip->m_last_error = MZ_ZIP_DECOMPRESSION_FAILED;
          goto LAB_00149b4f;
        }
        local_2fc8 = local_2fc8 + uVar8;
        local_2fd8 = local_2fd8 - uVar8;
        lVar7 = 0;
      }
      else {
        uVar8 = 0;
      }
    }
    in_buf_size = uVar8;
    tVar2 = tinfl_decompress(&inflator,(mz_uint8 *)((long)local_2fd0 + lVar7),&in_buf_size,
                             (mz_uint8 *)pBuf,(mz_uint8 *)((long)pBuf + sVar3),&out_buf_size,
                             (local_2fd8 != 0) + 4 + (uint)(local_2fd8 != 0));
    uVar8 = uVar8 - in_buf_size;
    lVar7 = lVar7 + in_buf_size;
    sVar3 = sVar3 + out_buf_size;
  } while (tVar2 == TINFL_STATUS_NEEDS_MORE_INPUT);
  if (tVar2 == TINFL_STATUS_DONE) {
    if (sVar3 == file_stat.m_uncomp_size) {
      mVar1 = 0;
      mVar5 = mz_crc32(0,(mz_uint8 *)pBuf,sVar3);
      if (mVar5 == file_stat.m_crc32) {
        mVar1 = 1;
      }
      else {
        pZip->m_last_error = MZ_ZIP_CRC_CHECK_FAILED;
      }
      goto LAB_00149b52;
    }
    pZip->m_last_error = MZ_ZIP_UNEXPECTED_DECOMPRESSED_SIZE;
  }
LAB_00149b4f:
  mVar1 = 0;
LAB_00149b52:
  if (pUser_read_buf == (void *)0x0 && pZip->m_pState->m_pMem == (void *)0x0) {
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_2fd0);
    return mVar1;
  }
  return mVar1;
}

Assistant:

mz_bool mz_zip_reader_extract_to_mem_no_alloc(mz_zip_archive *pZip, mz_uint file_index, void *pBuf, size_t buf_size, mz_uint flags, void *pUser_read_buf, size_t user_read_buf_size)
{
    int status = TINFL_STATUS_DONE;
    mz_uint64 needed_size, cur_file_ofs, comp_remaining, out_buf_ofs = 0, read_buf_size, read_buf_ofs = 0, read_buf_avail;
    mz_zip_archive_file_stat file_stat;
    void *pRead_buf;
    mz_uint32 local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
    tinfl_decompressor inflator;

    if ((!pZip) || (!pZip->m_pState) || ((buf_size) && (!pBuf)) || ((user_read_buf_size) && (!pUser_read_buf)) || (!pZip->m_pRead))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (!mz_zip_reader_file_stat(pZip, file_index, &file_stat))
        return MZ_FALSE;

    /* A directory or zero length file */
    if ((file_stat.m_is_directory) || (!file_stat.m_comp_size))
        return MZ_TRUE;

    /* Encryption and patch files are not supported. */
    if (file_stat.m_bit_flag & (MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_IS_ENCRYPTED | MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_USES_STRONG_ENCRYPTION | MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_COMPRESSED_PATCH_FLAG))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);

    /* This function only supports decompressing stored and deflate. */
    if ((!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (file_stat.m_method != 0) && (file_stat.m_method != MZ_DEFLATED))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_METHOD);

    /* Ensure supplied output buffer is large enough. */
    needed_size = (flags & MZ_ZIP_FLAG_COMPRESSED_DATA) ? file_stat.m_comp_size : file_stat.m_uncomp_size;
    if (buf_size < needed_size)
        return mz_zip_set_error(pZip, MZ_ZIP_BUF_TOO_SMALL);

    /* Read and parse the local directory entry. */
    cur_file_ofs = file_stat.m_local_header_ofs;
    if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    cur_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS) + MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
    if ((cur_file_ofs + file_stat.m_comp_size) > pZip->m_archive_size)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    if ((flags & MZ_ZIP_FLAG_COMPRESSED_DATA) || (!file_stat.m_method))
    {
        /* The file is stored or the caller has requested the compressed data. */
        if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf, (size_t)needed_size) != needed_size)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
        if ((flags & MZ_ZIP_FLAG_COMPRESSED_DATA) == 0)
        {
            if (mz_crc32(MZ_CRC32_INIT, (const mz_uint8 *)pBuf, (size_t)file_stat.m_uncomp_size) != file_stat.m_crc32)
                return mz_zip_set_error(pZip, MZ_ZIP_CRC_CHECK_FAILED);
        }
#endif

        return MZ_TRUE;
    }

    /* Decompress the file either directly from memory or from a file input buffer. */
    tinfl_init(&inflator);

    if (pZip->m_pState->m_pMem)
    {
        /* Read directly from the archive in memory. */
        pRead_buf = (mz_uint8 *)pZip->m_pState->m_pMem + cur_file_ofs;
        read_buf_size = read_buf_avail = file_stat.m_comp_size;
        comp_remaining = 0;
    }
    else if (pUser_read_buf)
    {
        /* Use a user provided read buffer. */
        if (!user_read_buf_size)
            return MZ_FALSE;
        pRead_buf = (mz_uint8 *)pUser_read_buf;
        read_buf_size = user_read_buf_size;
        read_buf_avail = 0;
        comp_remaining = file_stat.m_comp_size;
    }
    else
    {
        /* Temporarily allocate a read buffer. */
        read_buf_size = MZ_MIN(file_stat.m_comp_size, (mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE);
        if (((sizeof(size_t) == sizeof(mz_uint32))) && (read_buf_size > 0x7FFFFFFF))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (NULL == (pRead_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, (size_t)read_buf_size)))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

        read_buf_avail = 0;
        comp_remaining = file_stat.m_comp_size;
    }

    do
    {
        /* The size_t cast here should be OK because we've verified that the output buffer is >= file_stat.m_uncomp_size above */
        size_t in_buf_size, out_buf_size = (size_t)(file_stat.m_uncomp_size - out_buf_ofs);
        if ((!read_buf_avail) && (!pZip->m_pState->m_pMem))
        {
            read_buf_avail = MZ_MIN(read_buf_size, comp_remaining);
            if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pRead_buf, (size_t)read_buf_avail) != read_buf_avail)
            {
                status = TINFL_STATUS_FAILED;
                mz_zip_set_error(pZip, MZ_ZIP_DECOMPRESSION_FAILED);
                break;
            }
            cur_file_ofs += read_buf_avail;
            comp_remaining -= read_buf_avail;
            read_buf_ofs = 0;
        }
        in_buf_size = (size_t)read_buf_avail;
        status = tinfl_decompress(&inflator, (mz_uint8 *)pRead_buf + read_buf_ofs, &in_buf_size, (mz_uint8 *)pBuf, (mz_uint8 *)pBuf + out_buf_ofs, &out_buf_size, TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF | (comp_remaining ? TINFL_FLAG_HAS_MORE_INPUT : 0));
        read_buf_avail -= in_buf_size;
        read_buf_ofs += in_buf_size;
        out_buf_ofs += out_buf_size;
    } while (status == TINFL_STATUS_NEEDS_MORE_INPUT);

    if (status == TINFL_STATUS_DONE)
    {
        /* Make sure the entire file was decompressed, and check its CRC. */
        if (out_buf_ofs != file_stat.m_uncomp_size)
        {
            mz_zip_set_error(pZip, MZ_ZIP_UNEXPECTED_DECOMPRESSED_SIZE);
            status = TINFL_STATUS_FAILED;
        }
#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
        else if (mz_crc32(MZ_CRC32_INIT, (const mz_uint8 *)pBuf, (size_t)file_stat.m_uncomp_size) != file_stat.m_crc32)
        {
            mz_zip_set_error(pZip, MZ_ZIP_CRC_CHECK_FAILED);
            status = TINFL_STATUS_FAILED;
        }
#endif
    }

    if ((!pZip->m_pState->m_pMem) && (!pUser_read_buf))
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);

    return status == TINFL_STATUS_DONE;
}